

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_> *this,
          int i)

{
  Fad<Fad<double>_> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> local_18;
  
  pFVar1 = this->left_;
  local_18.fadexpr_.left_ = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    local_18.fadexpr_.left_ = (pFVar1->dx_).ptr_to_data + i;
  }
  local_18.fadexpr_.right_.defaultVal = 0;
  local_18.fadexpr_.right_.constant_ = (this->right_).constant_;
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<int>>>(__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val();}